

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

Iterator * leveldb::NewMergingIterator(Comparator *comparator,Iterator **children,int n)

{
  int in_EDX;
  undefined8 *in_RSI;
  MergingIterator *in_stack_00000020;
  undefined8 local_8;
  
  if (in_EDX == 0) {
    local_8 = NewEmptyIterator();
  }
  else if (in_EDX == 1) {
    local_8 = (Iterator *)*in_RSI;
  }
  else {
    local_8 = (Iterator *)operator_new(0x50);
    anon_unknown_0::MergingIterator::MergingIterator(in_stack_00000020,comparator,children,n);
  }
  return local_8;
}

Assistant:

Iterator* NewMergingIterator(const Comparator* comparator, Iterator** children,
                             int n) {
  assert(n >= 0);
  if (n == 0) {
    return NewEmptyIterator();
  } else if (n == 1) {
    return children[0];
  } else {
    return new MergingIterator(comparator, children, n);
  }
}